

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vk_mem_alloc.h
# Opt level: O2

void __thiscall VmaAllocator_T::FreeDedicatedMemory(VmaAllocator_T *this,VmaAllocation allocation)

{
  atomic<unsigned_int> *paVar1;
  atomic<unsigned_long> *paVar2;
  uint uVar3;
  VmaPool pVVar4;
  VkDeviceMemory hMemory;
  VmaDedicatedAllocationList *this_00;
  
  uVar3 = allocation->m_MemoryTypeIndex;
  pVVar4 = VmaAllocation_T::GetParentPool(allocation);
  this_00 = this->m_DedicatedAllocations + uVar3;
  if (pVVar4 != (VmaPool)0x0) {
    this_00 = &pVVar4->m_DedicatedAllocations;
  }
  VmaDedicatedAllocationList::Unregister(this_00,allocation);
  hMemory = VmaAllocation_T::GetMemory(allocation);
  FreeVulkanMemory(this,uVar3,allocation->m_Size,hMemory);
  uVar3 = (this->m_MemProps).memoryTypes[allocation->m_MemoryTypeIndex].heapIndex;
  LOCK();
  paVar2 = (this->m_Budget).m_AllocationBytes + uVar3;
  (paVar2->super___atomic_base<unsigned_long>)._M_i =
       (paVar2->super___atomic_base<unsigned_long>)._M_i - allocation->m_Size;
  UNLOCK();
  LOCK();
  paVar1 = (this->m_Budget).m_AllocationCount + uVar3;
  (paVar1->super___atomic_base<unsigned_int>)._M_i =
       (paVar1->super___atomic_base<unsigned_int>)._M_i - 1;
  UNLOCK();
  LOCK();
  paVar1 = &(this->m_Budget).m_OperationsSinceBudgetFetch;
  (paVar1->super___atomic_base<unsigned_int>)._M_i =
       (paVar1->super___atomic_base<unsigned_int>)._M_i + 1;
  UNLOCK();
  VmaAllocationObjectAllocator::Free(&this->m_AllocationObjectAllocator,allocation);
  return;
}

Assistant:

void VmaAllocator_T::FreeDedicatedMemory(const VmaAllocation allocation)
{
    VMA_ASSERT(allocation && allocation->GetType() == VmaAllocation_T::ALLOCATION_TYPE_DEDICATED);

    const uint32_t memTypeIndex = allocation->GetMemoryTypeIndex();
    VmaPool parentPool = allocation->GetParentPool();
    if(parentPool == VK_NULL_HANDLE)
    {
        // Default pool
        m_DedicatedAllocations[memTypeIndex].Unregister(allocation);
    }
    else
    {
        // Custom pool
        parentPool->m_DedicatedAllocations.Unregister(allocation);
    }

    VkDeviceMemory hMemory = allocation->GetMemory();

    /*
    There is no need to call this, because Vulkan spec allows to skip vkUnmapMemory
    before vkFreeMemory.

    if(allocation->GetMappedData() != VMA_NULL)
    {
        (*m_VulkanFunctions.vkUnmapMemory)(m_hDevice, hMemory);
    }
    */

    FreeVulkanMemory(memTypeIndex, allocation->GetSize(), hMemory);

    m_Budget.RemoveAllocation(MemoryTypeIndexToHeapIndex(allocation->GetMemoryTypeIndex()), allocation->GetSize());
    m_AllocationObjectAllocator.Free(allocation);

    VMA_DEBUG_LOG("    Freed DedicatedMemory MemoryTypeIndex=%u", memTypeIndex);
}